

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int resolveAsName(Parse *pParse,ExprList *pEList,Expr *pE)

{
  byte bVar1;
  Expr *pEVar2;
  long lVar3;
  long lVar4;
  
  if (((char)pEList->nExpr != ';') || ((long)*(int *)&pParse->db < 1)) {
    return 0;
  }
  pEVar2 = pEList->a[0].pExpr;
  lVar3 = 0;
  do {
    if ((*(byte *)((long)&pParse->rc + lVar3 * 0x18 + 1) & 3) == 0) {
      if ((&pParse->pVdbe)[lVar3 * 3] == (Vdbe *)0x0) {
        if (pEVar2 == (Expr *)0x0) {
LAB_00192ea3:
          return (int)lVar3 + 1;
        }
      }
      else if (pEVar2 != (Expr *)0x0) {
        lVar4 = 0;
        do {
          bVar1 = *(byte *)((long)&(&pParse->pVdbe)[lVar3 * 3]->db + lVar4);
          if (bVar1 == (&pEVar2->op)[lVar4]) {
            if ((ulong)bVar1 == 0) goto LAB_00192ea3;
          }
          else if (""[bVar1] != ""[(&pEVar2->op)[lVar4]]) break;
          lVar4 = lVar4 + 1;
        } while( true );
      }
    }
    lVar3 = lVar3 + 1;
    if (lVar3 == *(int *)&pParse->db) {
      return 0;
    }
  } while( true );
}

Assistant:

static int resolveAsName(
  Parse *pParse,     /* Parsing context for error messages */
  ExprList *pEList,  /* List of expressions to scan */
  Expr *pE           /* Expression we are trying to match */
){
  int i;             /* Loop counter */

  UNUSED_PARAMETER(pParse);

  if( pE->op==TK_ID ){
    const char *zCol;
    assert( !ExprHasProperty(pE, EP_IntValue) );
    zCol = pE->u.zToken;
    for(i=0; i<pEList->nExpr; i++){
      if( pEList->a[i].fg.eEName==ENAME_NAME
       && sqlite3_stricmp(pEList->a[i].zEName, zCol)==0
      ){
        return i+1;
      }
    }
  }
  return 0;
}